

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::FieldGenerator::SetOneofIndexBase
          (FieldGenerator *this,int index_base)

{
  OneofDescriptor *pOVar1;
  char *pcVar2;
  mapped_type *this_00;
  int __c;
  int i;
  undefined4 in_register_00000034;
  allocator<char> local_59;
  key_type local_58;
  string local_38;
  int local_18;
  int local_14;
  int index;
  int index_base_local;
  FieldGenerator *this_local;
  
  pcVar2 = (char *)CONCAT44(in_register_00000034,index_base);
  local_14 = index_base;
  _index = this;
  pOVar1 = FieldDescriptor::containing_oneof(this->descriptor_);
  if (pOVar1 != (OneofDescriptor *)0x0) {
    pOVar1 = FieldDescriptor::containing_oneof(this->descriptor_);
    pcVar2 = OneofDescriptor::index(pOVar1,pcVar2,__c);
    local_18 = (int)pcVar2 + local_14;
    SimpleItoa_abi_cxx11_(&local_38,(protobuf *)(ulong)(uint)-local_18,i);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"has_index",&local_59);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->variables_,&local_58);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void FieldGenerator::SetOneofIndexBase(int index_base) {
  if (descriptor_->containing_oneof() != NULL) {
    int index = descriptor_->containing_oneof()->index() + index_base;
    // Flip the sign to mark it as a oneof.
    variables_["has_index"] = SimpleItoa(-index);
  }
}